

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

function<void_(BaseSocket_*,_void_*)> * __thiscall
BaseSocket::BindErrorFunction
          (function<void_(BaseSocket_*,_void_*)> *__return_storage_ptr__,BaseSocket *this,
          function<void_(BaseSocket_*,_void_*)> *fError)

{
  BaseSocketImpl *pBVar1;
  function<void_(BaseSocket_*,_void_*)> local_40;
  function<void_(BaseSocket_*,_void_*)> *local_20;
  function<void_(BaseSocket_*,_void_*)> *fError_local;
  BaseSocket *this_local;
  
  local_20 = fError;
  fError_local = (function<void_(BaseSocket_*,_void_*)> *)this;
  this_local = (BaseSocket *)__return_storage_ptr__;
  pBVar1 = GetImpl(this);
  std::function<void_(BaseSocket_*,_void_*)>::function(&local_40,fError);
  (*pBVar1->_vptr_BaseSocketImpl[4])(__return_storage_ptr__,pBVar1,&local_40);
  std::function<void_(BaseSocket_*,_void_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(BaseSocket*, void*)> BaseSocket::BindErrorFunction(std::function<void(BaseSocket*, void*)> fError)
{
    return GetImpl()->BindErrorFunction(fError);
}